

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall
FIX::Session::nextResendRequest(Session *this,Message *resendRequest,UtcTimeStamp *timeStamp)

{
  int *this_00;
  message_order *pmVar1;
  message_order *pmVar2;
  message_order *hdrOrder;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  StringField *this_01;
  string *psVar7;
  BeginString *beginString_00;
  DataDictionary *this_02;
  ulong uVar8;
  Message *pMVar9;
  Message *this_03;
  reference pbVar10;
  FieldMap *pFVar11;
  size_t __n;
  signed_int value;
  signed_int value_00;
  signed_int value_01;
  void *__buf;
  uchar *in_R8;
  size_t in_R9;
  int local_83c;
  BeginSeqNo local_838;
  EndSeqNo local_7d8;
  int local_778;
  int local_774;
  int next_1;
  string local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  type local_6d0;
  Message *msg;
  message_order *messageOrder_1;
  message_order *trailerOrder_1;
  message_order *headerOrder_1;
  message_order *messageOrder;
  message_order *trailerOrder;
  message_order *headerOrder;
  DataDictionary *applicationDD;
  undefined1 local_630 [8];
  ApplVerID applVerID;
  Message msg_1;
  size_type soh;
  size_type equalSign;
  DataDictionary *sessionDD;
  string strMsgType;
  unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> pMsg;
  undefined1 local_408 [8];
  string messageString;
  int local_3e0;
  int iStack_3dc;
  bool appMessageJustSent;
  int current;
  int begin;
  MsgType msgType;
  undefined1 local_370 [8];
  MsgSeqNum msgSeqNum;
  iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  EndSeqNo local_2e8;
  int local_288;
  int local_284;
  int next;
  int local_21c;
  EndSeqNo local_218;
  undefined1 local_1b8 [8];
  string beginString;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  EndSeqNo endSeqNo;
  undefined1 local_88 [8];
  BeginSeqNo beginSeqNo;
  Locker l;
  UtcTimeStamp *timeStamp_local;
  Message *resendRequest_local;
  Session *this_local;
  
  uVar4 = verify(this,(EVP_PKEY_CTX *)resendRequest,(uchar *)0x0,0,in_R8,in_R9);
  if ((uVar4 & 1) == 0) {
    return;
  }
  Locker::Locker((Locker *)&beginSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_checksum,
                 &this->m_mutex);
  BeginSeqNo::BeginSeqNo((BeginSeqNo *)local_88);
  EndSeqNo::EndSeqNo((EndSeqNo *)local_f8);
  FieldMap::getField(&resendRequest->super_FieldMap,(FieldBase *)local_88);
  FieldMap::getField(&resendRequest->super_FieldMap,(FieldBase *)local_f8);
  uVar4 = IntField::operator_cast_to_int((IntField *)local_88);
  IntConvertor::convert_abi_cxx11_(&local_178,(IntConvertor *)(ulong)uVar4,value);
  std::operator+(&local_158,"Received ResendRequest FROM: ",&local_178);
  std::operator+(&local_138,&local_158," TO: ");
  uVar4 = IntField::operator_cast_to_int((IntField *)local_f8);
  IntConvertor::convert_abi_cxx11_
            ((string *)((long)&beginString.field_2 + 8),(IntConvertor *)(ulong)uVar4,value_00);
  std::operator+(&local_118,&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&beginString.field_2 + 8));
  SessionState::onEvent(&this->m_state,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)(beginString.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  this_01 = &SessionID::getBeginString(&this->m_sessionID)->super_StringField;
  psVar7 = StringField::operator_cast_to_string_(this_01);
  std::__cxx11::string::string((string *)local_1b8,(string *)psVar7);
  bVar3 = std::operator>=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1b8,"FIX.4.2");
  if (((!bVar3) || (iVar5 = IntField::operator_cast_to_int((IntField *)local_f8), iVar5 != 0)) &&
     ((bVar3 = std::operator<=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1b8,"FIX.4.2"), !bVar3 ||
      (iVar5 = IntField::operator_cast_to_int((IntField *)local_f8), iVar5 != 999999)))) {
    iVar5 = IntField::operator_cast_to_int((IntField *)local_f8);
    iVar6 = getExpectedSenderNum(this);
    if (iVar5 < iVar6) goto LAB_0028634f;
  }
  local_21c = getExpectedSenderNum(this);
  local_21c = local_21c + -1;
  EndSeqNo::EndSeqNo(&local_218,&local_21c);
  EndSeqNo::operator=((EndSeqNo *)local_f8,&local_218);
  EndSeqNo::~EndSeqNo(&local_218);
LAB_0028634f:
  if ((this->m_persistMessages & 1U) == 0) {
    local_284 = IntField::operator_cast_to_int((IntField *)local_f8);
    local_284 = local_284 + 1;
    EndSeqNo::EndSeqNo((EndSeqNo *)&next,&local_284);
    EndSeqNo::operator=((EndSeqNo *)local_f8,(EndSeqNo *)&next);
    EndSeqNo::~EndSeqNo((EndSeqNo *)&next);
    local_288 = SessionState::getNextSenderMsgSeqNum(&this->m_state);
    iVar5 = IntField::operator_cast_to_int((IntField *)local_f8);
    if (local_288 < iVar5) {
      EndSeqNo::EndSeqNo(&local_2e8,&local_288);
      EndSeqNo::operator=((EndSeqNo *)local_f8,&local_2e8);
      EndSeqNo::~EndSeqNo(&local_2e8);
    }
    iVar5 = IntField::operator_cast_to_int((IntField *)local_88);
    iVar6 = IntField::operator_cast_to_int((IntField *)local_f8);
    generateSequenceReset(this,iVar5,iVar6);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i);
    iVar5 = IntField::operator_cast_to_int((IntField *)local_88);
    iVar6 = IntField::operator_cast_to_int((IntField *)local_f8);
    SessionState::get(&this->m_state,iVar5,iVar6,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&i);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics.m_checksum);
    msgType.super_StringField.super_FieldBase.m_metrics._12_4_ = 0;
    MsgSeqNum::MsgSeqNum
              ((MsgSeqNum *)local_370,
               (SEQNUM *)&msgType.super_StringField.super_FieldBase.m_metrics.field_0xc);
    MsgType::MsgType((MsgType *)&current);
    iStack_3dc = 0;
    local_3e0 = IntField::operator_cast_to_int((IntField *)local_88);
    messageString.field_2._M_local_buf[0xf] = '\0';
    std::__cxx11::string::string((string *)local_408);
    msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
    while( true ) {
      pMsg._M_t.super___uniq_ptr_impl<FIX::Message,_std::default_delete<FIX::Message>_>._M_t.
      super__Tuple_impl<0UL,_FIX::Message_*,_std::default_delete<FIX::Message>_>.
      super__Head_base<0UL,_FIX::Message_*,_false>._M_head_impl =
           (__uniq_ptr_data<FIX::Message,_std::default_delete<FIX::Message>,_true,_true>)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics.m_checksum,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&pMsg);
      if (!bVar3) break;
      messageString.field_2._M_local_buf[0xf] = '\0';
      std::unique_ptr<FIX::Message,std::default_delete<FIX::Message>>::
      unique_ptr<std::default_delete<FIX::Message>,void>
                ((unique_ptr<FIX::Message,std::default_delete<FIX::Message>> *)
                 (strMsgType.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&sessionDD);
      beginString_00 = SessionID::getBeginString(&this->m_sessionID);
      this_02 = DataDictionaryProvider::getSessionDataDictionary
                          (&this->m_dataDictionaryProvider,beginString_00);
      bVar3 = DataDictionary::isMessageFieldsOrderPreserved(this_02);
      if (bVar3) {
        this_00 = &msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics.m_checksum;
        pbVar10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)this_00);
        std::__cxx11::string::find((char *)pbVar10,0x2c3aa6);
        pbVar10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)this_00);
        std::__cxx11::string::find_first_of((char)pbVar10,1);
        pbVar10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)this_00);
        std::__cxx11::string::substr((ulong)&msg_1.m_validStructure,(ulong)pbVar10);
        std::__cxx11::string::operator=((string *)&sessionDD,(string *)&msg_1.m_validStructure);
        std::__cxx11::string::~string((string *)&msg_1.m_validStructure);
      }
      bVar3 = SessionID::isFIXT(&this->m_sessionID);
      if (bVar3) {
        Message::Message((Message *)
                         &applVerID.super_StringField.super_FieldBase.m_metrics.m_checksum);
        pbVar10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics.m_checksum);
        Message::setStringHeader
                  ((Message *)&applVerID.super_StringField.super_FieldBase.m_metrics.m_checksum,
                   pbVar10);
        ApplVerID::ApplVerID((ApplVerID *)local_630);
        pFVar11 = &Message::getHeader((Message *)
                                      &applVerID.super_StringField.super_FieldBase.m_metrics.
                                       m_checksum)->super_FieldMap;
        bVar3 = FieldMap::getFieldIfSet(pFVar11,(FieldBase *)local_630);
        if (!bVar3) {
          ApplVerID::ApplVerID((ApplVerID *)&applicationDD,&this->m_senderDefaultApplVerID);
          ApplVerID::operator=((ApplVerID *)local_630,(ApplVerID *)&applicationDD);
          ApplVerID::~ApplVerID((ApplVerID *)&applicationDD);
        }
        headerOrder = (message_order *)
                      DataDictionaryProvider::getApplicationDataDictionary
                                (&this->m_dataDictionaryProvider,(ApplVerID *)local_630);
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          trailerOrder = DataDictionary::getHeaderOrderedFields(this_02);
          messageOrder = DataDictionary::getTrailerOrderedFields(this_02);
          headerOrder_1 =
               DataDictionary::getMessageOrderedFields
                         ((DataDictionary *)headerOrder,(string *)&sessionDD);
          pMVar9 = (Message *)operator_new(0x158);
          hdrOrder = trailerOrder;
          pmVar2 = messageOrder;
          pmVar1 = headerOrder_1;
          pbVar10 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics.m_checksum
                               );
          Message::Message(pMVar9,hdrOrder,pmVar2,pmVar1,pbVar10,this_02,
                           (DataDictionary *)headerOrder,
                           (bool)(this->m_validateLengthAndChecksum & 1));
          std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::reset
                    ((unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> *)
                     ((long)&strMsgType.field_2 + 8),pMVar9);
        }
        else {
          pMVar9 = (Message *)operator_new(0x158);
          pbVar10 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics.m_checksum
                               );
          Message::Message(pMVar9,pbVar10,this_02,(DataDictionary *)headerOrder,
                           (bool)(this->m_validateLengthAndChecksum & 1));
          std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::reset
                    ((unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> *)
                     ((long)&strMsgType.field_2 + 8),pMVar9);
        }
        ApplVerID::~ApplVerID((ApplVerID *)local_630);
        Message::~Message((Message *)
                          &applVerID.super_StringField.super_FieldBase.m_metrics.m_checksum);
      }
      else {
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          trailerOrder_1 = DataDictionary::getHeaderOrderedFields(this_02);
          messageOrder_1 = DataDictionary::getTrailerOrderedFields(this_02);
          msg = (Message *)DataDictionary::getMessageOrderedFields(this_02,(string *)&sessionDD);
          this_03 = (Message *)operator_new(0x158);
          pmVar2 = trailerOrder_1;
          pmVar1 = messageOrder_1;
          pMVar9 = msg;
          pbVar10 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics.m_checksum
                               );
          Message::Message(this_03,pmVar2,pmVar1,(message_order *)pMVar9,pbVar10,this_02,
                           (bool)(this->m_validateLengthAndChecksum & 1));
          std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::reset
                    ((unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> *)
                     ((long)&strMsgType.field_2 + 8),this_03);
        }
        else {
          pMVar9 = (Message *)operator_new(0x158);
          pbVar10 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics.m_checksum
                               );
          Message::Message(pMVar9,pbVar10,this_02,(bool)(this->m_validateLengthAndChecksum & 1));
          std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::reset
                    ((unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> *)
                     ((long)&strMsgType.field_2 + 8),pMVar9);
        }
      }
      local_6d0 = std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::operator*
                            ((unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> *)
                             ((long)&strMsgType.field_2 + 8));
      pFVar11 = &Message::getHeader(local_6d0)->super_FieldMap;
      FieldMap::getField(pFVar11,(FieldBase *)local_370);
      pFVar11 = &Message::getHeader(local_6d0)->super_FieldMap;
      FieldMap::getField(pFVar11,(FieldBase *)&current);
      iVar5 = IntField::operator_cast_to_int((IntField *)local_370);
      if ((local_3e0 != iVar5) && (iStack_3dc == 0)) {
        iStack_3dc = local_3e0;
      }
      bVar3 = Message::isAdminMsgType((MsgType *)&current);
      if (bVar3) {
        if (iStack_3dc == 0) {
          iStack_3dc = IntField::operator_cast_to_int((IntField *)local_370);
        }
      }
      else {
        bVar3 = resend(this,local_6d0);
        if (bVar3) {
          if (iStack_3dc != 0) {
            iVar5 = IntField::operator_cast_to_int((IntField *)local_370);
            generateSequenceReset(this,iStack_3dc,iVar5);
          }
          __n = 9;
          iVar5 = 10;
          psVar7 = Message::toString(local_6d0,(string *)local_408,8,9,10);
          send(this,(int)psVar7,__buf,__n,iVar5);
          uVar4 = IntField::operator_cast_to_int((IntField *)local_370);
          IntConvertor::convert_abi_cxx11_(&local_710,(IntConvertor *)(ulong)uVar4,value_01);
          std::operator+(&local_6f0,"Resending Message: ",&local_710);
          SessionState::onEvent(&this->m_state,&local_6f0);
          std::__cxx11::string::~string((string *)&local_6f0);
          std::__cxx11::string::~string((string *)&local_710);
          iStack_3dc = 0;
          messageString.field_2._M_local_buf[0xf] = '\x01';
        }
        else if (iStack_3dc == 0) {
          iStack_3dc = IntField::operator_cast_to_int((IntField *)local_370);
        }
      }
      local_3e0 = IntField::operator_cast_to_int((IntField *)local_370);
      local_3e0 = local_3e0 + 1;
      std::__cxx11::string::~string((string *)&sessionDD);
      std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::~unique_ptr
                ((unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> *)
                 ((long)&strMsgType.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics.m_checksum);
    }
    if (iStack_3dc != 0) {
      iVar5 = IntField::operator_cast_to_int((IntField *)local_370);
      generateSequenceReset(this,iStack_3dc,iVar5 + 1);
    }
    iVar5 = IntField::operator_cast_to_int((IntField *)local_f8);
    iVar6 = IntField::operator_cast_to_int((IntField *)local_370);
    if (iVar6 < iVar5) {
      local_774 = IntField::operator_cast_to_int((IntField *)local_f8);
      local_774 = local_774 + 1;
      EndSeqNo::EndSeqNo((EndSeqNo *)&next_1,&local_774);
      EndSeqNo::operator=((EndSeqNo *)local_f8,(EndSeqNo *)&next_1);
      EndSeqNo::~EndSeqNo((EndSeqNo *)&next_1);
      local_778 = SessionState::getNextSenderMsgSeqNum(&this->m_state);
      iVar5 = IntField::operator_cast_to_int((IntField *)local_f8);
      if (local_778 < iVar5) {
        EndSeqNo::EndSeqNo(&local_7d8,&local_778);
        EndSeqNo::operator=((EndSeqNo *)local_f8,&local_7d8);
        EndSeqNo::~EndSeqNo(&local_7d8);
      }
      if ((messageString.field_2._M_local_buf[0xf] & 1U) != 0) {
        local_83c = IntField::operator_cast_to_int((IntField *)local_370);
        local_83c = local_83c + 1;
        BeginSeqNo::BeginSeqNo(&local_838,&local_83c);
        BeginSeqNo::operator=((BeginSeqNo *)local_88,&local_838);
        BeginSeqNo::~BeginSeqNo(&local_838);
      }
      iVar5 = IntField::operator_cast_to_int((IntField *)local_88);
      iVar6 = IntField::operator_cast_to_int((IntField *)local_f8);
      generateSequenceReset(this,iVar5,iVar6);
    }
    pFVar11 = &Message::getHeader(resendRequest)->super_FieldMap;
    FieldMap::getField(pFVar11,(FieldBase *)local_370);
    bVar3 = isTargetTooHigh(this,(MsgSeqNum *)local_370);
    if ((!bVar3) && (bVar3 = isTargetTooLow(this,(MsgSeqNum *)local_370), !bVar3)) {
      SessionState::incrNextTargetMsgSeqNum(&this->m_state);
    }
    std::__cxx11::string::~string((string *)local_408);
    MsgType::~MsgType((MsgType *)&current);
    MsgSeqNum::~MsgSeqNum((MsgSeqNum *)local_370);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
  }
  std::__cxx11::string::~string((string *)local_1b8);
  EndSeqNo::~EndSeqNo((EndSeqNo *)local_f8);
  BeginSeqNo::~BeginSeqNo((BeginSeqNo *)local_88);
  Locker::~Locker((Locker *)&beginSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_checksum);
  return;
}

Assistant:

void Session::nextResendRequest( const Message& resendRequest, const UtcTimeStamp& timeStamp )
{
  if ( !verify( resendRequest, false, false ) ) return ;

  Locker l( m_mutex );

  BeginSeqNo beginSeqNo;
  EndSeqNo endSeqNo;
  resendRequest.getField( beginSeqNo );
  resendRequest.getField( endSeqNo );

  m_state.onEvent( "Received ResendRequest FROM: "
       + IntConvertor::convert( beginSeqNo ) +
                   " TO: " + IntConvertor::convert( endSeqNo ) );

  std::string beginString = m_sessionID.getBeginString();
  if ( (beginString >= FIX::BeginString_FIX42 && endSeqNo == 0) ||
       (beginString <= FIX::BeginString_FIX42 && endSeqNo == 999999) ||
       (endSeqNo >= getExpectedSenderNum()) )
  { endSeqNo = getExpectedSenderNum() - 1; }

  if ( !m_persistMessages )
  {
    endSeqNo = EndSeqNo(endSeqNo + 1);
    int next = m_state.getNextSenderMsgSeqNum();
    if( endSeqNo > next )
      endSeqNo = EndSeqNo(next);
    generateSequenceReset( beginSeqNo, endSeqNo );
    return;
  }

  std::vector < std::string > messages;
  m_state.get( beginSeqNo, endSeqNo, messages );

  std::vector < std::string > ::iterator i;
  MsgSeqNum msgSeqNum(0);
  MsgType msgType;
  int begin = 0;
  int current = beginSeqNo;
  bool appMessageJustSent = false;
  std::string messageString;

  for ( i = messages.begin(); i != messages.end(); ++i )
  {
    appMessageJustSent = false;
    SmartPtr<FIX::Message> pMsg;
    std::string strMsgType;
    const DataDictionary& sessionDD =
      m_dataDictionaryProvider.getSessionDataDictionary(m_sessionID.getBeginString());
    if (sessionDD.isMessageFieldsOrderPreserved())
    {
      std::string::size_type equalSign = (*i).find("\00135=");
      equalSign += 4;
      std::string::size_type soh = (*i).find_first_of('\001', equalSign);
      strMsgType = (*i).substr(equalSign, soh - equalSign);
#ifdef HAVE_EMX
      if (FIX::Message::isAdminMsgType(strMsgType) == false)
      {
        equalSign = (*i).find("\0019426=", soh);
        if (equalSign == std::string::npos)
          throw FIX::IOException("EMX message type (9426) not found");

        equalSign += 6;
        soh = (*i).find_first_of('\001', equalSign);
        if (soh == std::string::npos)
          throw FIX::IOException("EMX message type (9426) soh char not found");
        strMsgType.assign((*i).substr(equalSign, soh - equalSign));
      }
#endif
    }

    if( m_sessionID.isFIXT() )
    {
      Message msg;
      msg.setStringHeader(*i);
      ApplVerID applVerID;
      if( !msg.getHeader().getFieldIfSet(applVerID) )
        applVerID = m_senderDefaultApplVerID;

      const DataDictionary& applicationDD =
          m_dataDictionaryProvider.getApplicationDataDictionary(applVerID);
      if (strMsgType.empty())
        pMsg.reset( new Message( *i, sessionDD, applicationDD, m_validateLengthAndChecksum ));
      else
      {
        const message_order & headerOrder = sessionDD.getHeaderOrderedFields();
        const message_order & trailerOrder = sessionDD.getTrailerOrderedFields();
        const message_order & messageOrder = applicationDD.getMessageOrderedFields(strMsgType);
        pMsg.reset( new Message( headerOrder, trailerOrder, messageOrder, *i, sessionDD, applicationDD, m_validateLengthAndChecksum ));
      }
    }
    else
    {
      if (strMsgType.empty())
        pMsg.reset( new Message( *i, sessionDD, m_validateLengthAndChecksum ));
      else
      {
        const message_order & headerOrder = sessionDD.getHeaderOrderedFields();
        const message_order & trailerOrder = sessionDD.getTrailerOrderedFields();
        const message_order & messageOrder = sessionDD.getMessageOrderedFields(strMsgType);
        pMsg.reset(new Message(headerOrder, trailerOrder, messageOrder, *i, sessionDD, m_validateLengthAndChecksum ));
      }
    }

    Message & msg = *pMsg;

    msg.getHeader().getField( msgSeqNum );
    msg.getHeader().getField( msgType );

    if( (current != msgSeqNum) && !begin )
      begin = current;

    if ( Message::isAdminMsgType( msgType ) )
    {
      if ( !begin ) begin = msgSeqNum;
    }
    else
    {
      if ( resend( msg ) )
      {
        if ( begin ) generateSequenceReset( begin, msgSeqNum );
        send( msg.toString(messageString) );
        m_state.onEvent( "Resending Message: "
                         + IntConvertor::convert( msgSeqNum ) );
        begin = 0;
        appMessageJustSent = true;
      }
      else
      { if ( !begin ) begin = msgSeqNum; }
    }
    current = msgSeqNum + 1;
  }
  if ( begin )
  {
    generateSequenceReset( begin, msgSeqNum + 1 );
  }

  if ( endSeqNo > msgSeqNum )
  {
    endSeqNo = EndSeqNo(endSeqNo + 1);
    int next = m_state.getNextSenderMsgSeqNum();
    if( endSeqNo > next )
      endSeqNo = EndSeqNo(next);
    if ( appMessageJustSent )
      beginSeqNo = msgSeqNum + 1;
    generateSequenceReset( beginSeqNo, endSeqNo );
  }

  resendRequest.getHeader().getField( msgSeqNum );
  if( !isTargetTooHigh(msgSeqNum) && !isTargetTooLow(msgSeqNum) )
    m_state.incrNextTargetMsgSeqNum();
}